

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O2

void rtcOccluded4(int *valid,RTCScene hscene,RTCRay4 *ray,RTCOccludedArguments *args)

{
  long lVar1;
  RayHit ray1;
  RayQueryContext context;
  RTCRayQueryContext defaultContext;
  RTCIntersectArguments local_50;
  
  if (args == (RTCOccludedArguments *)0x0) {
    args = (RTCOccludedArguments *)&local_50;
    local_50.flags = RTC_RAY_QUERY_FLAG_INCOHERENT;
    local_50.feature_mask = RTC_FEATURE_FLAG_ALL;
    local_50.context = (RTCRayQueryContext *)0x0;
    local_50.filter = (RTCFilterFunctionN)0x0;
    local_50.intersect = (RTCIntersectFunctionN)0x0;
  }
  else {
    context.user = args->context;
    if (context.user != (RTCRayQueryContext *)0x0) goto LAB_001863c4;
  }
  context.user = &defaultContext;
  defaultContext.instID[0] = 0xffffffff;
  defaultContext.instPrimID[0] = 0xffffffff;
LAB_001863c4:
  context.scene = (Scene *)hscene;
  context.args = (RTCIntersectArguments *)args;
  if (*(long *)(hscene + 0xa8) == 0) {
    for (lVar1 = -0x10; lVar1 != 0; lVar1 = lVar1 + 4) {
      if (*(int *)((long)valid + lVar1 + 0x10) != 0) {
        ray1.super_RayK<1>.org.field_0.m128[0] = *(float *)((long)ray->org_y + lVar1);
        ray1.super_RayK<1>.org.field_0.m128[1] = *(float *)((long)ray->org_z + lVar1);
        ray1.super_RayK<1>.org.field_0.m128[2] = *(float *)((long)ray->tnear + lVar1);
        ray1.super_RayK<1>.org.field_0.m128[3] = *(float *)((long)ray->dir_x + lVar1);
        ray1.super_RayK<1>.dir.field_0.m128[0] = *(float *)((long)ray->dir_y + lVar1);
        ray1.super_RayK<1>.dir.field_0.m128[1] = *(float *)((long)ray->dir_z + lVar1);
        ray1.super_RayK<1>.dir.field_0.m128[2] = *(float *)((long)ray->time + lVar1);
        ray1.super_RayK<1>.tfar = *(float *)((long)ray->mask + lVar1);
        ray1.super_RayK<1>.dir.field_0.m128[3] = *(float *)((long)ray->tfar + lVar1);
        ray1.super_RayK<1>.mask = *(int *)((long)ray->id + lVar1);
        ray1.super_RayK<1>.id = *(int *)((long)ray->flags + lVar1);
        ray1.super_RayK<1>.flags = *(int *)((long)ray[1].org_x + lVar1);
        ray1.Ng.field_0.field_0.x = *(float *)((long)ray[1].org_y + lVar1);
        ray1.Ng.field_0.field_0.y = *(float *)((long)ray[1].org_z + lVar1);
        ray1.Ng.field_0.field_0.z = *(float *)((long)ray[1].tnear + lVar1);
        ray1.u = *(float *)((long)ray[1].dir_x + lVar1);
        ray1.v = *(float *)((long)ray[1].dir_y + lVar1);
        ray1.primID = *(uint *)((long)ray[1].dir_z + lVar1);
        ray1.geomID = *(uint *)((long)ray[1].time + lVar1);
        ray1.instID[0] = *(uint *)((long)ray[1].tfar + lVar1);
        ray1.instPrimID[0] = *(uint *)((long)ray[1].mask + lVar1);
        (**(code **)(hscene + 0x80))(hscene + 0x58,&ray1,&context);
        *(uint *)((long)ray[1].time + lVar1) = ray1.geomID;
      }
    }
  }
  else {
    (**(code **)(hscene + 0xa0))(valid,hscene + 0x58,ray,&context);
  }
  return;
}

Assistant:

RTC_API void rtcOccluded4 (const int* valid, RTCScene hscene, RTCRay4* ray, RTCOccludedArguments* args) 
  {
    Scene* scene = (Scene*) hscene;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcOccluded4);

#if defined(DEBUG)
    RTC_VERIFY_HANDLE(hscene);
    if (scene->isModified()) throw_RTCError(RTC_ERROR_INVALID_OPERATION,"scene not committed");
    if (((size_t)valid) & 0x0F) throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "mask not aligned to 16 bytes");   
    if (((size_t)ray)   & 0x0F) throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "ray not aligned to 16 bytes");   
#endif
    STAT(size_t cnt=0; for (size_t i=0; i<4; i++) cnt += ((int*)valid)[i] == -1;);
    STAT3(shadow.travs,cnt,cnt,cnt);

    RTCOccludedArguments defaultArgs;
    if (unlikely(args == nullptr)) {
      rtcInitOccludedArguments(&defaultArgs);
      args = &defaultArgs;
    }
    RTCRayQueryContext* user_context = args->context;
    
    RTCRayQueryContext defaultContext;
    if (unlikely(user_context == nullptr)) {
      rtcInitRayQueryContext(&defaultContext);
      user_context = &defaultContext;
    }
    RayQueryContext context(scene,user_context,args);

    if (likely(scene->intersectors.intersector4))
       scene->intersectors.occluded4(valid,*ray,&context);

    else {
      RayHit4* ray4 = (RayHit4*) ray;
      for (size_t i=0; i<4; i++) {
        if (!valid[i]) continue;
        RayHit ray1; ray4->get(i,ray1);
        scene->intersectors.occluded((RTCRay&)ray1,&context);
        ray4->geomID[i] = ray1.geomID; 
      }
    }
    
    RTC_CATCH_END2(scene);
  }